

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_GetDefaultAnchor(float *anchor_x,float *anchor_y)

{
  float *anchor_y_local;
  float *anchor_x_local;
  
  if (_gpu_current_renderer != (GPU_Renderer *)0x0) {
    if (anchor_x != (float *)0x0) {
      *anchor_x = _gpu_current_renderer->default_image_anchor_x;
    }
    if (anchor_y != (float *)0x0) {
      *anchor_y = _gpu_current_renderer->default_image_anchor_y;
    }
  }
  return;
}

Assistant:

void GPU_GetDefaultAnchor(float* anchor_x, float* anchor_y)
{
    if(_gpu_current_renderer == NULL)
        return;
    
    if(anchor_x != NULL)
        *anchor_x = _gpu_current_renderer->default_image_anchor_x;
    
    if(anchor_y != NULL)
        *anchor_y = _gpu_current_renderer->default_image_anchor_y;
}